

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O0

mraa_boolean_t mraa_file_contains(char *filename,char *content)

{
  FILE *__stream;
  __ssize_t _Var1;
  char *pcVar2;
  FILE *fh;
  char *line;
  size_t len;
  char *file;
  char *pcStack_20;
  mraa_boolean_t found;
  char *content_local;
  char *filename_local;
  
  file._4_4_ = 0;
  if ((filename == (char *)0x0) || (content == (char *)0x0)) {
    filename_local._4_4_ = 0;
  }
  else {
    pcStack_20 = content;
    content_local = filename;
    len = (size_t)mraa_file_unglob(filename);
    if ((char *)len != (char *)0x0) {
      line = (char *)0x0;
      fh = (FILE *)0x0;
      __stream = fopen((char *)len,"r");
      if (__stream == (FILE *)0x0) {
        free((void *)len);
        return 0;
      }
      do {
        _Var1 = getline((char **)&fh,(size_t *)&line,__stream);
        if (_Var1 == -1 || file._4_4_ != 0) goto LAB_0010a188;
        pcVar2 = strstr((char *)fh,pcStack_20);
      } while (pcVar2 == (char *)0x0);
      file._4_4_ = 1;
LAB_0010a188:
      fclose(__stream);
      free((void *)len);
      free(fh);
    }
    filename_local._4_4_ = file._4_4_;
  }
  return filename_local._4_4_;
}

Assistant:

mraa_boolean_t
mraa_file_contains(const char* filename, const char* content)
{
    mraa_boolean_t found = 0;
    if ((filename == NULL) || (content == NULL)) {
        return 0;
    }

    char* file = mraa_file_unglob(filename);
    if (file != NULL) {
        size_t len = 0;
        char* line = NULL;
        FILE* fh = fopen(file, "r");
        if (fh == NULL) {
            free(file);
            return 0;
        }
        while ((getline(&line, &len, fh) != -1) && (found == 0)) {
            if (strstr(line, content)) {
                found = 1;
                break;
            }
        }
        fclose(fh);
        free(file);
        free(line);
    }
    return found;
}